

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::CampaignManager::Open(CampaignManager *this,string *name,UserOptions *options)

{
  ostream *poVar1;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (this->m_Options).active = (options->campaign).active;
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).hostname);
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).campaignstorepath);
  std::__cxx11::string::_M_assign((string *)&(this->m_Options).cachepath);
  (this->m_Options).verbose = (options->campaign).verbose;
  std::operator+(&local_58,&this->m_CampaignDir,'/');
  std::operator+(&local_98,&local_58,name);
  std::operator+(&local_78,&local_98,"_");
  std::__cxx11::to_string(&sStack_b8,this->m_WriterRank);
  std::operator+(&local_38,&local_78,&sStack_b8);
  std::__cxx11::string::operator=((string *)&this->m_Name,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  if (0 < (this->m_Options).verbose) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Campaign Manager ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_WriterRank);
    poVar1 = std::operator<<(poVar1," Open(");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_Name);
    std::operator<<(poVar1,")\n");
  }
  this->m_Opened = true;
  return;
}

Assistant:

void CampaignManager::Open(const std::string &name, const UserOptions &options)
{
    const UserOptions::Campaign &opts = options.campaign;
    m_Options.active = opts.active;
    m_Options.hostname = opts.hostname;
    m_Options.campaignstorepath = opts.campaignstorepath;
    m_Options.cachepath = opts.cachepath;
    m_Options.verbose = opts.verbose;

    m_Name = m_CampaignDir + PathSeparator + name + "_" + std::to_string(m_WriterRank);
    if (m_Options.verbose > 0)
    {
        std::cout << "Campaign Manager " << m_WriterRank << " Open(" << m_Name << ")\n";
    }
    m_Opened = true;
}